

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,uint64 param_1,void *pData_ptr)

{
  uint64 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  uint uVar6;
  bool bVar7;
  vq_node *pvVar8;
  vq_node *pvVar9;
  uint uVar10;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_5c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  local_58;
  value_type local_30;
  
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = *(uint *)((long)pData_ptr + 4);
  pvVar8 = (this->m_nodes).m_p;
  pvVar9 = pvVar8 + *pData_ptr;
  pvVar8 = pvVar8 + uVar10;
  if (uVar10 != *pData_ptr) {
    *(undefined8 *)(pvVar8->m_centroid).m_s = *(undefined8 *)(pvVar9->m_centroid).m_s;
  }
  *(undefined4 *)((long)&pvVar8->m_codebook_index + 3) =
       *(undefined4 *)((long)&pvVar9->m_codebook_index + 3);
  uVar1 = pvVar9->m_total_weight;
  fVar5 = pvVar9->m_variance;
  uVar6 = pvVar9->m_begin;
  iVar2 = pvVar9->m_left;
  iVar3 = pvVar9->m_right;
  iVar4 = pvVar9->m_codebook_index;
  pvVar8->m_end = pvVar9->m_end;
  pvVar8->m_left = iVar2;
  pvVar8->m_right = iVar3;
  pvVar8->m_codebook_index = iVar4;
  pvVar8->m_total_weight = uVar1;
  pvVar8->m_variance = fVar5;
  pvVar8->m_begin = uVar6;
  local_30.m_variance = (this->m_nodes).m_p[uVar10].m_variance;
  local_30.m_index = uVar10;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&local_58,&local_30);
  local_5c = uVar10 + 1;
  if (1 < *(uint *)((long)pData_ptr + 8)) {
    uVar10 = 1;
    do {
      bVar7 = split_node(this,&local_58,&local_5c,(task_pool *)0x0);
      if (!bVar7) break;
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(uint *)((long)pData_ptr + 8));
  }
  pvVar8 = (this->m_nodes).m_p;
  pvVar9 = pvVar8 + *(uint *)((long)pData_ptr + 4);
  pvVar8 = pvVar8 + *pData_ptr;
  if (*pData_ptr != *(uint *)((long)pData_ptr + 4)) {
    *(undefined8 *)(pvVar8->m_centroid).m_s = *(undefined8 *)(pvVar9->m_centroid).m_s;
  }
  *(undefined4 *)((long)&pvVar8->m_codebook_index + 3) =
       *(undefined4 *)((long)&pvVar9->m_codebook_index + 3);
  uVar1 = pvVar9->m_total_weight;
  fVar5 = pvVar9->m_variance;
  uVar6 = pvVar9->m_begin;
  iVar2 = pvVar9->m_left;
  iVar3 = pvVar9->m_right;
  iVar4 = pvVar9->m_codebook_index;
  pvVar8->m_end = pvVar9->m_end;
  pvVar8->m_left = iVar2;
  pvVar8->m_right = iVar3;
  pvVar8->m_codebook_index = iVar4;
  pvVar8->m_total_weight = uVar1;
  pvVar8->m_variance = fVar5;
  pvVar8->m_begin = uVar6;
  (this->m_nodes).m_p[*pData_ptr].m_alternative = true;
  if (local_58.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void split_alternative_node_task(uint64, void* pData_ptr)
        {
            split_alternative_node_task_params* pParams = (split_alternative_node_task_params*)pData_ptr;
            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = pParams->alternative_node, end_node = begin_node, splits = 0;

            m_nodes[end_node] = m_nodes[pParams->main_node];
            node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
            end_node++;
            splits++;

            while (splits < pParams->max_splits && split_node(node_queue, end_node))
            {
                splits++;
            }

            m_nodes[pParams->main_node] = m_nodes[pParams->alternative_node];
            m_nodes[pParams->main_node].m_alternative = true;
        }